

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sl_serial.c
# Opt level: O1

slReturn setTermOptionsBaud(int fdPort,int baud)

{
  errInfo error;
  int iVar1;
  long lVar2;
  slReturn pvVar3;
  int *piVar4;
  char *pcVar5;
  speed_t __speed;
  char *pcVar6;
  termios options;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  uint32_t uVar13;
  undefined4 uVar14;
  termios local_14c;
  errorInfo_slReturn local_110;
  errorInfo_slReturn local_f0;
  errorInfo_slReturn local_d0;
  errorInfo_slReturn local_b0;
  errorInfo_slReturn local_90;
  errorInfo_slReturn local_70;
  errorInfo_slReturn local_50;
  errorInfo_slReturn local_30;
  
  if (fdPort < 0) {
    createErrorInfo(&local_30,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                    ,"setTermOptionsBaud",0xba,(slReturn)0x0);
    uVar11 = SUB84(local_30.functionName,0);
    uVar12 = (undefined4)((ulong)local_30.functionName >> 0x20);
    uVar13 = local_30.lineNumber;
    uVar14 = local_30._28_4_;
    uVar7 = SUB84(local_30.cause,0);
    uVar8 = (undefined4)((ulong)local_30.cause >> 0x20);
    uVar9 = SUB84(local_30.fileName,0);
    uVar10 = (undefined4)((ulong)local_30.fileName >> 0x20);
    pcVar5 = "Invalid serial port file descriptor";
  }
  else {
    lVar2 = 0;
    do {
      if (validRates[lVar2].baud == baud) {
        __speed = validRates[lVar2].cookie;
        goto LAB_00109f6b;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x14);
    __speed = 0xffffffff;
LAB_00109f6b:
    if (-1 < (int)__speed) {
      iVar1 = tcdrain(fdPort);
      if (iVar1 < 0) {
        createErrorInfo(&local_70,
                        "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                        ,"setTermOptionsBaud",0xc1,(slReturn)0x0);
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        pcVar6 = "error from tcdrain(): %s";
      }
      else {
        iVar1 = tcgetattr(fdPort,&local_14c);
        if (iVar1 < 0) {
          createErrorInfo(&local_90,
                          "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                          ,"setTermOptionsBaud",0xc3,(slReturn)0x0);
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          pcVar6 = "error from tcgetattr(): %s";
        }
        else {
          iVar1 = cfsetispeed(&local_14c,__speed);
          if (iVar1 < 0) {
            createErrorInfo(&local_b0,
                            "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                            ,"setTermOptionsBaud",0xc5,(slReturn)0x0);
            piVar4 = __errno_location();
            pcVar5 = strerror(*piVar4);
            pcVar6 = "error from cfsetispeed(): %s";
          }
          else {
            iVar1 = cfsetospeed(&local_14c,__speed);
            if (iVar1 < 0) {
              createErrorInfo(&local_d0,
                              "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                              ,"setTermOptionsBaud",199,(slReturn)0x0);
              piVar4 = __errno_location();
              pcVar5 = strerror(*piVar4);
              pcVar6 = "error from cfsetospeed(): %s";
            }
            else {
              iVar1 = tcflush(fdPort,0);
              if (iVar1 < 0) {
                createErrorInfo(&local_f0,
                                "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                                ,"setTermOptionsBaud",0xc9,(slReturn)0x0);
                piVar4 = __errno_location();
                pcVar5 = strerror(*piVar4);
                pcVar6 = "error from tcflush(): %s";
              }
              else {
                iVar1 = tcsetattr(fdPort,0,&local_14c);
                if (-1 < iVar1) {
                  pvVar3 = makeOkReturn();
                  return pvVar3;
                }
                createErrorInfo(&local_110,
                                "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                                ,"setTermOptionsBaud",0xcb,(slReturn)0x0);
                piVar4 = __errno_location();
                pcVar5 = strerror(*piVar4);
                pcVar6 = "error from tcsetattr(): %s";
              }
            }
          }
        }
      }
      pvVar3 = makeErrorFmtMsgReturn(pcVar6,pcVar5);
      return pvVar3;
    }
    createErrorInfo(&local_50,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                    ,"setTermOptionsBaud",0xbc,(slReturn)0x0);
    uVar11 = SUB84(local_50.functionName,0);
    uVar12 = (undefined4)((ulong)local_50.functionName >> 0x20);
    uVar13 = local_50.lineNumber;
    uVar14 = local_50._28_4_;
    uVar7 = SUB84(local_50.cause,0);
    uVar8 = (undefined4)((ulong)local_50.cause >> 0x20);
    uVar9 = SUB84(local_50.fileName,0);
    uVar10 = (undefined4)((ulong)local_50.fileName >> 0x20);
    pcVar5 = "Invalid baud rate";
  }
  error.cause._4_4_ = uVar8;
  error.cause._0_4_ = uVar7;
  error.fileName._0_4_ = uVar9;
  error.fileName._4_4_ = uVar10;
  error.functionName._0_4_ = uVar11;
  error.functionName._4_4_ = uVar12;
  error.lineNumber = uVar13;
  error._28_4_ = uVar14;
  pvVar3 = makeErrorMsgReturn(error,pcVar5);
  return pvVar3;
}

Assistant:

extern slReturn setTermOptionsBaud( int fdPort, int baud ) {

    if( fdPort < 0 ) return makeErrorMsgReturn( ERR_ROOT, "Invalid serial port file descriptor" );
    int baudCookie = getBaudRateCookie( baud );
    if( baudCookie < 0 ) return makeErrorMsgReturn( ERR_ROOT, "Invalid baud rate" );

    struct termios options;
    int result;
    result = tcdrain( fdPort );
    if( result < 0 ) return makeErrorFmtMsgReturn( ERR_ROOT, "error from tcdrain(): %s", strerror(errno) );
    result = tcgetattr( fdPort, &options );
    if( result < 0 ) return makeErrorFmtMsgReturn( ERR_ROOT, "error from tcgetattr(): %s", strerror(errno) );
    result = cfsetispeed( &options, (speed_t) baudCookie );
    if( result < 0 ) return makeErrorFmtMsgReturn( ERR_ROOT, "error from cfsetispeed(): %s", strerror(errno) );
    result = cfsetospeed( &options, (speed_t) baudCookie );
    if( result < 0 ) return makeErrorFmtMsgReturn( ERR_ROOT, "error from cfsetospeed(): %s", strerror(errno) );
    result = tcflush( fdPort, TCIFLUSH );
    if( result < 0 ) return makeErrorFmtMsgReturn( ERR_ROOT, "error from tcflush(): %s", strerror(errno) );
    result = tcsetattr( fdPort, TCSANOW, &options );
    if( result < 0 ) return makeErrorFmtMsgReturn( ERR_ROOT, "error from tcsetattr(): %s", strerror(errno) );
    return makeOkReturn();
}